

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O2

ssize_t tnt_object_add_array(tnt_stream *s,uint32_t size)

{
  uint32_t *puVar1;
  tnt_sbo_type tVar2;
  void *pvVar3;
  tnt_sbuf_object *sbo;
  tnt_sbo_stack *ptVar4;
  byte bVar5;
  int iVar6;
  char *pcVar7;
  ssize_t sVar8;
  tnt_sbuf_object *ptVar9;
  char local_36;
  char local_35 [4];
  char local_31 [3];
  char data [6];
  
  pvVar3 = s->data;
  sbo = *(tnt_sbuf_object **)((long)pvVar3 + 0x30);
  bVar5 = sbo->stack_size;
  if (bVar5 != 0) {
    puVar1 = &sbo->stack[bVar5 - 1].size;
    *puVar1 = *puVar1 + 1;
  }
  ptVar9 = sbo;
  if (bVar5 == sbo->stack_alloc) {
    iVar6 = tnt_sbuf_object_grow_stack(sbo);
    if (iVar6 == -1) {
      return -1;
    }
    bVar5 = sbo->stack_size;
    ptVar9 = *(tnt_sbuf_object **)((long)s->data + 0x30);
  }
  ptVar4 = sbo->stack;
  ptVar4[bVar5].size = 0;
  ptVar4[bVar5].offset = *(size_t *)((long)pvVar3 + 8);
  ptVar4[bVar5].type = '\x05';
  sbo->stack_size = bVar5 + 1;
  tVar2 = ptVar9->type;
  if (tVar2 == TNT_SBO_PACKED) {
    pcVar7 = local_35;
  }
  else if (tVar2 == TNT_SBO_SPARSE) {
    pcVar7 = local_31;
  }
  else {
    if (tVar2 != TNT_SBO_SIMPLE) {
      return -1;
    }
    pcVar7 = mp_encode_array(&local_36,size);
  }
  sVar8 = (*s->write)(s,&local_36,(long)pcVar7 - (long)&local_36);
  return sVar8;
}

Assistant:

ssize_t
tnt_object_add_array (struct tnt_stream *s, uint32_t size)
{
	struct tnt_sbuf_object *sbo = TNT_SOBJ_CAST(s);
	if (sbo->stack_size > 0)
		sbo->stack[sbo->stack_size - 1].size += 1;
	char data[6], *end;
	struct tnt_stream_buf  *sb  = TNT_SBUF_CAST(s);
	if (sbo->stack_size == sbo->stack_alloc)
		if (tnt_sbuf_object_grow_stack(sbo) == -1)
			return -1;
	sbo->stack[sbo->stack_size].size = 0;
	sbo->stack[sbo->stack_size].offset = sb->size;
	sbo->stack[sbo->stack_size].type = MP_ARRAY;
	sbo->stack_size += 1;
	if (TNT_SOBJ_CAST(s)->type == TNT_SBO_SIMPLE) {
		end = mp_encode_array(data, size);
	} else if (TNT_SOBJ_CAST(s)->type == TNT_SBO_SPARSE) {
		end = mp_encode_array32(data, 0);
	} else if (TNT_SOBJ_CAST(s)->type == TNT_SBO_PACKED) {
		end = mp_encode_array(data, 0);
	} else {
		return -1;
	}
	ssize_t rv = s->write(s, data, end - data);
	return rv;
}